

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_ntlm.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  uint *puVar5;
  char *pcVar6;
  long lnum;
  char *endptr;
  char *msgbuf;
  char *pcStack_588;
  _Bool use_cached_creds;
  char *helper_domain;
  char *helper_proto;
  char *helper_user;
  char *pcStack_568;
  int arg;
  char *env;
  long testnum;
  size_t size;
  char *type3_output;
  char *type1_output;
  char *type3_input;
  char *type1_input;
  char *pcStack_528;
  int error;
  char *filename;
  FILE *stream;
  char logfilename [256];
  char buf [1024];
  char **argv_local;
  int argc_local;
  
  type3_input = (char *)0x0;
  type1_output = (char *)0x0;
  type3_output = (char *)0x0;
  size = 0;
  testnum = 0;
  helper_user._4_4_ = 1;
  helper_proto = "unknown";
  helper_domain = "unknown";
  pcStack_588 = "unknown";
  msgbuf._7_1_ = 0;
  logfilename[0xf8] = '\0';
  iVar2 = helper_user._4_4_;
  while (helper_user._4_4_ = iVar2, helper_user._4_4_ < argc) {
    iVar2 = strcmp("--use-cached-creds",argv[helper_user._4_4_]);
    if (iVar2 == 0) {
      msgbuf._7_1_ = 1;
      iVar2 = helper_user._4_4_ + 1;
    }
    else {
      iVar2 = strcmp("--helper-protocol",argv[helper_user._4_4_]);
      if (iVar2 == 0) {
        iVar2 = helper_user._4_4_ + 1;
        if (iVar2 < argc) {
          helper_domain = argv[iVar2];
          iVar2 = helper_user._4_4_ + 2;
        }
      }
      else {
        iVar2 = strcmp("--username",argv[helper_user._4_4_]);
        if (iVar2 == 0) {
          iVar2 = helper_user._4_4_ + 1;
          if (iVar2 < argc) {
            helper_proto = argv[iVar2];
            iVar2 = helper_user._4_4_ + 2;
          }
        }
        else {
          iVar2 = strcmp("--domain",argv[helper_user._4_4_]);
          if (iVar2 != 0) {
            puts(
                "Usage: fake_ntlm [option]\n --use-cached-creds\n --helper-protocol [protocol]\n --username [username]\n --domain [domain]"
                );
            exit(1);
          }
          iVar2 = helper_user._4_4_ + 1;
          if (iVar2 < argc) {
            pcStack_588 = argv[iVar2];
            iVar2 = helper_user._4_4_ + 2;
          }
        }
      }
    }
  }
  pcStack_568 = getenv("CURL_NTLM_AUTH_TESTNUM");
  if (pcStack_568 == (char *)0x0) {
    curl_mfprintf(_stderr,"Test number not specified in CURL_NTLM_AUTH_TESTNUM");
    exit(1);
  }
  pcVar3 = (char *)strtol(pcStack_568,(char **)&lnum,10);
  pcVar6 = pcStack_568;
  sVar4 = strlen(pcStack_568);
  if (((char *)lnum != pcVar6 + sVar4) || ((long)pcVar3 < 1)) {
    curl_mfprintf(_stderr,"Test number not valid in CURL_NTLM_AUTH_TESTNUM");
    exit(1);
  }
  env = pcVar3;
  curl_msnprintf((char *)&stream,0x100,"log/fake_ntlm%ld.log",pcVar3);
  serverlogfile = (char *)&stream;
  pcVar6 = "no";
  if ((msgbuf._7_1_ & 1) != 0) {
    pcVar6 = "yes";
  }
  logmsg("fake_ntlm (user: %s) (proto: %s) (domain: %s) (cached creds: %s)",helper_proto,
         helper_domain,pcStack_588,pcVar6);
  pcStack_568 = getenv("CURL_NTLM_AUTH_SRCDIR");
  if (pcStack_568 != (char *)0x0) {
    path = pcStack_568;
  }
  pcStack_528 = test2file((long)env);
  filename = (char *)fopen64(pcStack_528,"rb");
  if ((FILE *)filename != (FILE *)0x0) {
    type1_input._4_4_ =
         getpart(&type3_input,(size_t *)&testnum,"ntlm_auth_type1","input",(FILE *)filename);
    fclose((FILE *)filename);
    if ((type1_input._4_4_ != 0) || (testnum == 0)) {
      logmsg("getpart() type 1 input failed with error: %d",(ulong)type1_input._4_4_);
      exit(1);
    }
    filename = (char *)fopen64(pcStack_528,"rb");
    if ((FILE *)filename == (FILE *)0x0) {
      puVar5 = (uint *)__errno_location();
      uVar1 = *puVar5;
      type1_input._4_4_ = uVar1;
      pcVar6 = strerror(uVar1);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar1,pcVar6);
      logmsg("Error opening file: %s",pcStack_528);
      logmsg("Couldn\'t open test file %ld",env);
      exit(1);
    }
    testnum = 0;
    type1_input._4_4_ =
         getpart(&type1_output,(size_t *)&testnum,"ntlm_auth_type3","input",(FILE *)filename);
    fclose((FILE *)filename);
    if ((type1_input._4_4_ == 0) && (testnum != 0)) {
      while( true ) {
        while( true ) {
          pcVar6 = fgets(logfilename + 0xf8,0x400,_stdin);
          if (pcVar6 == (char *)0x0) {
            logmsg("Exit");
            return 1;
          }
          iVar2 = strcmp(logfilename + 0xf8,type3_input);
          pcVar6 = type1_output;
          if (iVar2 == 0) break;
          sVar4 = strlen(type1_output);
          iVar2 = strncmp(logfilename + 0xf8,pcVar6,sVar4);
          if (iVar2 != 0) {
            curl_mprintf("Unknown request\n");
            endptr = printable(logfilename + 0xf8,0);
            if (endptr == (char *)0x0) {
              logmsg("OOM formatting invalid input: \'%s\'\n",logfilename + 0xf8);
            }
            else {
              logmsg("invalid input: \'%s\'\n",endptr);
              free(endptr);
            }
            exit(1);
          }
          filename = (char *)fopen64(pcStack_528,"rb");
          if ((FILE *)filename == (FILE *)0x0) {
            puVar5 = (uint *)__errno_location();
            uVar1 = *puVar5;
            type1_input._4_4_ = uVar1;
            pcVar6 = strerror(uVar1);
            logmsg("fopen() failed with error: %d %s",(ulong)uVar1,pcVar6);
            logmsg("Error opening file: %s",pcStack_528);
            logmsg("Couldn\'t open test file %ld",env);
            exit(1);
          }
          testnum = 0;
          type1_input._4_4_ =
               getpart((char **)&size,(size_t *)&testnum,"ntlm_auth_type3","output",(FILE *)filename
                      );
          fclose((FILE *)filename);
          if ((type1_input._4_4_ != 0) || (testnum == 0)) {
            logmsg("getpart() type 3 output failed with error: %d",(ulong)type1_input._4_4_);
            exit(1);
          }
          curl_mprintf("%s",size);
          fflush(_stdout);
        }
        filename = (char *)fopen64(pcStack_528,"rb");
        if ((FILE *)filename == (FILE *)0x0) {
          puVar5 = (uint *)__errno_location();
          uVar1 = *puVar5;
          type1_input._4_4_ = uVar1;
          pcVar6 = strerror(uVar1);
          logmsg("fopen() failed with error: %d %s",(ulong)uVar1,pcVar6);
          logmsg("Error opening file: %s",pcStack_528);
          logmsg("Couldn\'t open test file %ld",env);
          exit(1);
        }
        testnum = 0;
        type1_input._4_4_ =
             getpart(&type3_output,(size_t *)&testnum,"ntlm_auth_type1","output",(FILE *)filename);
        fclose((FILE *)filename);
        if ((type1_input._4_4_ != 0) || (testnum == 0)) break;
        curl_mprintf("%s",type3_output);
        fflush(_stdout);
      }
      logmsg("getpart() type 1 output failed with error: %d",(ulong)type1_input._4_4_);
      exit(1);
    }
    logmsg("getpart() type 3 input failed with error: %d",(ulong)type1_input._4_4_);
    exit(1);
  }
  puVar5 = (uint *)__errno_location();
  uVar1 = *puVar5;
  type1_input._4_4_ = uVar1;
  pcVar6 = strerror(uVar1);
  logmsg("fopen() failed with error: %d %s",(ulong)uVar1,pcVar6);
  logmsg("Error opening file: %s",pcStack_528);
  logmsg("Couldn\'t open test file %ld",env);
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
  char buf[1024];
  char logfilename[256];
  FILE *stream;
  char *filename;
  int error;
  char *type1_input = NULL, *type3_input = NULL;
  char *type1_output = NULL, *type3_output = NULL;
  size_t size = 0;
  long testnum;
  const char *env;
  int arg = 1;
  const char *helper_user = "unknown";
  const char *helper_proto = "unknown";
  const char *helper_domain = "unknown";
  bool use_cached_creds = FALSE;
  char *msgbuf;

  buf[0] = '\0';

  while(argc > arg) {
    if(!strcmp("--use-cached-creds", argv[arg])) {
      use_cached_creds = TRUE;
      arg++;
    }
    else if(!strcmp("--helper-protocol", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_proto = argv[arg++];
    }
    else if(!strcmp("--username", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_user = argv[arg++];
    }
    else if(!strcmp("--domain", argv[arg])) {
      arg++;
      if(argc > arg)
        helper_domain = argv[arg++];
    }
    else {
      puts("Usage: fake_ntlm [option]\n"
           " --use-cached-creds\n"
           " --helper-protocol [protocol]\n"
           " --username [username]\n"
           " --domain [domain]");
      exit(1);
    }
  }

  env = getenv("CURL_NTLM_AUTH_TESTNUM");
  if(env) {
    char *endptr;
    long lnum = strtol(env, &endptr, 10);
    if((endptr != env + strlen(env)) || (lnum < 1L)) {
      fprintf(stderr, "Test number not valid in CURL_NTLM_AUTH_TESTNUM");
      exit(1);
    }
    testnum = lnum;
  }
  else {
    fprintf(stderr, "Test number not specified in CURL_NTLM_AUTH_TESTNUM");
    exit(1);
  }

  /* logmsg cannot be used until this file name is set */
  snprintf(logfilename, sizeof(logfilename), LOGFILE, testnum);
  serverlogfile = logfilename;

  logmsg("fake_ntlm (user: %s) (proto: %s) (domain: %s) (cached creds: %s)",
         helper_user, helper_proto, helper_domain,
         (use_cached_creds) ? "yes" : "no");

  env = getenv("CURL_NTLM_AUTH_SRCDIR");
  if(env) {
    path = env;
  }

  filename = test2file(testnum);
  stream = fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("Error opening file: %s", filename);
    logmsg("Couldn't open test file %ld", testnum);
    exit(1);
  }
  else {
    /* get the ntlm_auth input/output */
    error = getpart(&type1_input, &size, "ntlm_auth_type1", "input", stream);
    fclose(stream);
    if(error || size == 0) {
      logmsg("getpart() type 1 input failed with error: %d", error);
      exit(1);
    }
  }

  stream = fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("Error opening file: %s", filename);
    logmsg("Couldn't open test file %ld", testnum);
    exit(1);
  }
  else {
    size = 0;
    error = getpart(&type3_input, &size, "ntlm_auth_type3", "input", stream);
    fclose(stream);
    if(error || size == 0) {
      logmsg("getpart() type 3 input failed with error: %d", error);
      exit(1);
    }
  }

  while(fgets(buf, sizeof(buf), stdin)) {
    if(strcmp(buf, type1_input) == 0) {
      stream = fopen(filename, "rb");
      if(!stream) {
        error = errno;
        logmsg("fopen() failed with error: %d %s", error, strerror(error));
        logmsg("Error opening file: %s", filename);
        logmsg("Couldn't open test file %ld", testnum);
        exit(1);
      }
      else {
        size = 0;
        error = getpart(&type1_output, &size, "ntlm_auth_type1", "output",
                        stream);
        fclose(stream);
        if(error || size == 0) {
          logmsg("getpart() type 1 output failed with error: %d", error);
          exit(1);
        }
      }
      printf("%s", type1_output);
      fflush(stdout);
    }
    else if(strncmp(buf, type3_input, strlen(type3_input)) == 0) {
      stream = fopen(filename, "rb");
      if(!stream) {
        error = errno;
        logmsg("fopen() failed with error: %d %s", error, strerror(error));
        logmsg("Error opening file: %s", filename);
        logmsg("Couldn't open test file %ld", testnum);
        exit(1);
      }
      else {
        size = 0;
        error = getpart(&type3_output, &size, "ntlm_auth_type3", "output",
                        stream);
        fclose(stream);
        if(error || size == 0) {
          logmsg("getpart() type 3 output failed with error: %d", error);
          exit(1);
        }
      }
      printf("%s", type3_output);
      fflush(stdout);
    }
    else {
      printf("Unknown request\n");
      msgbuf = printable(buf, 0);
      if(msgbuf) {
        logmsg("invalid input: '%s'\n", msgbuf);
        free(msgbuf);
      }
      else
        logmsg("OOM formatting invalid input: '%s'\n", buf);
      exit(1);
    }
  }
  logmsg("Exit");
  return 1;
}